

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O0

void __thiscall
helics::Translator::Translator
          (Translator *this,Core *core,string_view translatorName,InterfaceHandle ihandle)

{
  string_view actName;
  char *in_RCX;
  size_t in_RDX;
  Core *in_RDI;
  undefined4 in_R8D;
  InterfaceHandle unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  
  actName._M_str = in_RCX;
  actName._M_len = in_RDX;
  Interface::Interface
            ((Interface *)CONCAT44(in_R8D,in_stack_ffffffffffffffe8),in_RDI,unaff_retaddr,actName);
  in_RDI->_vptr_Core = (_func_int **)&PTR__Translator_009c3bb8;
  *(undefined1 *)&in_RDI[7]._vptr_Core = 0;
  std::shared_ptr<helics::TranslatorOperations>::shared_ptr
            ((shared_ptr<helics::TranslatorOperations> *)0x3e6ba9);
  return;
}

Assistant:

Translator::Translator(Core* core, std::string_view translatorName, InterfaceHandle ihandle):
    Interface(core, ihandle, translatorName)
{
}